

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxHarrisRT<double>::selectEnter
          (SPxHarrisRT<double> *this,double *val,int param_2,bool param_3)

{
  uint uVar1;
  undefined1 auVar2 [16];
  long *plVar3;
  double *pdVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ulong *puVar8;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined8 *puVar9;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined8 uVar10;
  uint uVar12;
  VectorBase<double> *pVVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined8 uVar28;
  uint local_16c;
  double local_168;
  double max;
  undefined1 local_158 [16];
  DataKey local_140;
  undefined1 local_138 [16];
  long local_128;
  long *local_120;
  double local_118;
  ulong uStack_110;
  long *local_100;
  long *local_f8;
  VectorBase<double> *local_f0;
  long local_e8;
  double *local_e0;
  SSVectorBase<double> *local_d8;
  SSVectorBase<double> *local_d0;
  long *local_c8;
  long *local_c0;
  double rmaxabs;
  double cmaxabs;
  undefined1 local_a8 [16];
  double local_98;
  ulong uStack_90;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  double local_60;
  double local_58;
  ulong uStack_50;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  undefined8 uVar11;
  
  local_140.info = 0;
  local_140.idx = -1;
  max = 0.0;
  cmaxabs = 1.0;
  rmaxabs = 1.0;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(this->super_SPxRatioTester<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar18 = -(ulong)((local_40._M_ptr)->s_epsilon_multiplier == 1.0);
  local_a8._8_8_ = 0;
  local_a8._0_8_ =
       ~uVar18 & (ulong)((local_40._M_ptr)->s_epsilon_multiplier * 0.0001) |
       uVar18 & 0x3f1a36e2eb1c432d;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  dVar25 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)CONCAT44(extraout_var,iVar6));
  local_88._8_4_ = extraout_XMM0_Dc;
  local_88._0_8_ = dVar25;
  local_88._12_4_ = extraout_XMM0_Dd;
  dVar25 = degenerateEps(this);
  local_138._8_4_ = extraout_XMM0_Dc_00;
  local_138._0_8_ = dVar25;
  local_138._12_4_ = extraout_XMM0_Dd_00;
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_120 = *(long **)(CONCAT44(extraout_var_00,iVar6) + 0x6c0);
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar17 = *(long *)(CONCAT44(extraout_var_01,iVar6) + 0x6c0);
  local_d8 = (SSVectorBase<double> *)(lVar17 + 0x20);
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  pVVar13 = *(VectorBase<double> **)(CONCAT44(extraout_var_02,iVar6) + 0x6b8);
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_e8 = *(long *)(CONCAT44(extraout_var_03,iVar6) + 0x6b8);
  local_d0 = (SSVectorBase<double> *)(local_e8 + 0x20);
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_f8 = *(long **)(CONCAT44(extraout_var_04,iVar6) + 0x6d8);
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_100 = *(long **)(CONCAT44(extraout_var_05,iVar6) + 0x6e0);
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_c0 = *(long **)(CONCAT44(extraout_var_06,iVar6) + 0x6e8);
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_c8 = *(long **)(CONCAT44(extraout_var_07,iVar6) + 0x6f0);
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_08,iVar6) + 0x6b8) + 0x20));
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_09,iVar6) + 0x6c0) + 0x20));
  local_128 = lVar17;
  local_f0 = pVVar13;
  local_e0 = val;
  if (*val <= (double)local_88._0_8_) {
    local_158 = ZEXT816(0);
    auVar2 = local_158;
    local_158._0_8_ = 0.0;
    if (*val < -(double)local_88._0_8_) {
      local_118 = -local_138._0_8_;
      uStack_110 = local_138._8_8_ ^ 0x8000000000000000;
      local_158 = auVar2;
LAB_001d140d:
      pdVar4 = local_e0;
      max = *local_e0;
      iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
      local_60 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_23,iVar6) + 0x368))
                                   ((long *)CONCAT44(extraout_var_23,iVar6));
      minDelta(this,&rmaxabs,&max,*(int *)(lVar17 + 0x28),*(int **)(lVar17 + 0x30),
               *(double **)(lVar17 + 0x40),(double *)*local_120,(double *)*local_100,
               (double *)*local_f8);
      minDelta(this,&cmaxabs,&max,*(int *)(local_e8 + 0x28),*(int **)(local_e8 + 0x30),
               *(double **)(local_e8 + 0x40),
               (pVVar13->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,(double *)*local_c8,(double *)*local_c0);
      if ((max == *pdVar4) && (!NAN(max) && !NAN(*pdVar4))) {
        uVar28._0_4_ = local_140.info;
        uVar28._4_4_ = local_140.idx;
        return (SPxId)uVar28;
      }
      puVar9 = (undefined8 *)infinity();
      uVar19 = (undefined4)*puVar9;
      uVar20 = (undefined4)((ulong)*puVar9 >> 0x20);
      local_58 = rmaxabs * (double)local_88._0_8_ * 0.001;
      local_78 = cmaxabs * (double)local_88._0_8_;
      uStack_70 = 0;
      uVar15 = *(uint *)(lVar17 + 0x28);
      uStack_50 = 0;
      local_98 = -local_58;
      uStack_90 = 0x8000000000000000;
      local_168 = 0.0;
      local_16c = 0xffffffff;
      do {
        local_158._4_4_ = uVar20;
        local_158._0_4_ = uVar19;
        local_158._8_8_ = 0;
        lVar16 = lVar17;
        uVar21 = local_138._0_4_;
        uVar22 = local_138._4_4_;
        uVar23 = 0;
        uVar24 = 0;
        uVar12 = uVar15;
LAB_001d155d:
        do {
          do {
            while( true ) {
              plVar3 = local_120;
              lVar17 = local_128;
              uVar15 = uVar15 - 1;
              if ((int)uVar12 < 1) {
                local_78 = local_78 * 0.001;
                uVar15 = *(uint *)(local_e8 + 0x28);
                local_58 = -local_78;
                uStack_50 = uStack_70 ^ 0x8000000000000000;
                local_98 = (double)CONCAT44(local_98._4_4_,0xffffffff);
                goto LAB_001d1723;
              }
              uVar12 = uVar12 - 1;
              uVar1 = *(uint *)(*(long *)(lVar16 + 0x30) + (ulong)uVar15 * 4);
              lVar14 = (long)(int)uVar1;
              dVar25 = *(double *)(*(long *)(lVar16 + 0x40) + lVar14 * 8);
              uVar28 = 0;
              if (dVar25 <= local_58) break;
              dVar27 = *(double *)(*local_100 + lVar14 * 8) - *(double *)(*local_120 + lVar14 * 8);
              if (dVar27 < (double)CONCAT44(uVar22,uVar21) ||
                  dVar27 == (double)CONCAT44(uVar22,uVar21)) {
                lVar16 = local_128;
                if ((max <= dVar27 / dVar25) && (dVar27 = dVar27 / dVar25, local_168 < dVar25))
                goto LAB_001d16a9;
              }
              else {
                iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                SPxSolverBase<double>::shiftLPbound
                          ((SPxSolverBase<double> *)CONCAT44(extraout_var_24,iVar6),uVar1,
                           *(double *)(*plVar3 + lVar14 * 8));
LAB_001d1629:
                lVar16 = local_128;
                uVar21 = local_138._0_4_;
                uVar22 = local_138._4_4_;
                uVar19 = local_158._0_4_;
                uVar20 = local_158._4_4_;
                uVar23 = local_158._8_4_;
                uVar24 = local_158._12_4_;
              }
            }
            if (local_98 <= dVar25) {
              SSVectorBase<double>::clearNum(local_d8,uVar12);
              uVar21 = local_138._0_4_;
              uVar22 = local_138._4_4_;
              uVar19 = local_158._0_4_;
              uVar20 = local_158._4_4_;
              uVar23 = local_158._8_4_;
              uVar24 = local_158._12_4_;
              goto LAB_001d155d;
            }
            dVar27 = *(double *)(*local_f8 + lVar14 * 8) - *(double *)(*local_120 + lVar14 * 8);
            if (dVar27 < local_118) {
              iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
              SPxSolverBase<double>::shiftUPbound
                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_25,iVar6),uVar1,
                         *(double *)(*plVar3 + lVar14 * 8));
              goto LAB_001d1629;
            }
            dVar27 = dVar27 / dVar25;
            lVar16 = local_128;
          } while (dVar27 < max);
          uVar28 = 0x8000000000000000;
          dVar25 = -dVar25;
        } while (dVar25 <= local_168);
LAB_001d16a9:
        local_168 = dVar27;
        local_158._8_8_ = uVar28;
        local_158._0_8_ = dVar25;
        iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        local_140 = (DataKey)SPxSolverBase<double>::id
                                       ((SPxSolverBase<double> *)CONCAT44(extraout_var_26,iVar6),
                                        uVar1);
        uVar19 = SUB84(local_168,0);
        uVar20 = (undefined4)((ulong)local_168 >> 0x20);
        local_168 = (double)local_158._0_8_;
        local_16c = uVar1;
      } while( true );
    }
LAB_001d1ac8:
    *local_e0 = (double)local_158._0_8_;
    uVar10._0_4_ = local_140.info;
    uVar10._4_4_ = local_140.idx;
    return (SPxId)uVar10;
  }
  local_58 = -local_138._0_8_;
  uStack_50 = local_138._8_8_ ^ 0x8000000000000000;
LAB_001d0cf7:
  pdVar4 = local_e0;
  max = *local_e0;
  iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_60 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 0x368))
                               ((long *)CONCAT44(extraout_var_10,iVar6));
  maxDelta(this,&rmaxabs,&max,*(int *)(lVar17 + 0x28),*(int **)(lVar17 + 0x30),
           *(double **)(lVar17 + 0x40),(double *)*local_120,(double *)*local_100,(double *)*local_f8
          );
  maxDelta(this,&cmaxabs,&max,*(int *)(local_e8 + 0x28),*(int **)(local_e8 + 0x30),
           *(double **)(local_e8 + 0x40),
           (pVVar13->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start,(double *)*local_c8,(double *)*local_c0);
  if ((max == *pdVar4) && (!NAN(max) && !NAN(*pdVar4))) {
    uVar11._0_4_ = local_140.info;
    uVar11._4_4_ = local_140.idx;
    return (SPxId)uVar11;
  }
  puVar8 = (ulong *)infinity();
  local_158._8_4_ = DAT_00478010._8_4_;
  local_158._0_8_ = *puVar8 ^ (ulong)DAT_00478010;
  local_158._12_4_ = DAT_00478010._12_4_;
  dVar27 = local_88._0_8_;
  dVar25 = rmaxabs * 0.001 * dVar27;
  uStack_70 = local_88._8_8_;
  local_78 = dVar27;
  if (dVar27 <= dVar25) {
    local_78 = dVar25;
  }
  dVar27 = cmaxabs * 0.001 * dVar27;
  uVar15 = *(uint *)(lVar17 + 0x28);
  local_98 = (double)((ulong)local_78 ^ (ulong)DAT_00478010);
  uStack_90 = uStack_70 ^ DAT_00478010._8_8_;
  local_118 = 0.0;
  uVar19 = local_88._0_4_;
  uVar20 = local_88._4_4_;
  uVar21 = local_88._8_4_;
  uVar22 = local_88._12_4_;
  uVar12 = uVar15;
  local_16c = 0xffffffff;
LAB_001d0e53:
  while( true ) {
    plVar3 = local_120;
    lVar16 = local_128;
    uVar15 = uVar15 - 1;
    if ((int)uVar12 < 1) break;
    uVar12 = uVar12 - 1;
    uVar1 = *(uint *)(*(long *)(lVar17 + 0x30) + (ulong)uVar15 * 4);
    lVar14 = (long)(int)uVar1;
    dVar25 = *(double *)(*(long *)(lVar17 + 0x40) + lVar14 * 8);
    uVar28 = 0;
    if (local_78 < dVar25) {
      dVar26 = *(double *)(*local_f8 + lVar14 * 8) - *(double *)(*local_120 + lVar14 * 8);
      if (local_58 <= dVar26) goto LAB_001d0f4a;
      iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
      SPxSolverBase<double>::shiftUPbound
                ((SPxSolverBase<double> *)CONCAT44(extraout_var_11,iVar6),uVar1,
                 *(double *)(*plVar3 + lVar14 * 8) - (double)local_138._0_8_);
LAB_001d0f37:
      lVar17 = local_128;
      uVar19 = local_88._0_4_;
      uVar20 = local_88._4_4_;
      uVar21 = local_88._8_4_;
      uVar22 = local_88._12_4_;
    }
    else if (local_98 <= dVar25) {
      SSVectorBase<double>::clearNum(local_d8,uVar12);
      uVar19 = local_88._0_4_;
      uVar20 = local_88._4_4_;
      uVar21 = local_88._8_4_;
      uVar22 = local_88._12_4_;
    }
    else {
      dVar26 = *(double *)(*local_100 + lVar14 * 8) - *(double *)(*local_120 + lVar14 * 8);
      if ((double)local_138._0_8_ < dVar26) {
        iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        SPxSolverBase<double>::shiftLPbound
                  ((SPxSolverBase<double> *)CONCAT44(extraout_var_12,iVar6),uVar1,
                   *(double *)(*plVar3 + lVar14 * 8) + (double)local_138._0_8_);
        goto LAB_001d0f37;
      }
      dVar26 = dVar26 / dVar25;
      lVar17 = lVar16;
      if (dVar26 <= max) {
        uVar28 = 0x8000000000000000;
        dVar25 = -dVar25;
        goto LAB_001d0fa2;
      }
    }
  }
  local_78 = (double)CONCAT44(uVar20,uVar19);
  if ((double)CONCAT44(uVar20,uVar19) <= dVar27) {
    local_78 = dVar27;
  }
  uVar15 = *(uint *)(local_e8 + 0x28);
  uStack_70 = CONCAT44(uVar22,uVar21);
  local_98 = -local_78;
  uStack_90 = CONCAT44(uVar22,uVar21) ^ 0x8000000000000000;
  local_168._0_4_ = -1;
  uVar19 = local_158._0_4_;
  uVar20 = local_158._4_4_;
  uVar21 = local_158._8_4_;
  uVar22 = local_158._12_4_;
LAB_001d103d:
  local_158._4_4_ = uVar20;
  local_158._0_4_ = uVar19;
  local_158._8_4_ = uVar21;
  local_158._12_4_ = uVar22;
  uVar12 = uVar15;
  do {
    pVVar13 = local_f0;
    uVar15 = uVar15 - 1;
    if ((int)uVar12 < 1) {
      iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
      dVar25 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar6) + 0x368))
                                 ((long *)CONCAT44(extraout_var_17,iVar6));
      pVVar13 = local_f0;
      if ((local_60 != dVar25) || (NAN(local_60) || NAN(dVar25))) goto LAB_001d0cf7;
      if (-1 < local_168._0_4_) {
        iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        bVar5 = SPxSolverBase<double>::isBasic
                          ((SPxSolverBase<double> *)CONCAT44(extraout_var_18,iVar6),
                           (SPxId *)&local_140);
        if (!bVar5) goto LAB_001d1ac8;
        SSVectorBase<double>::clearNum(local_d0,local_168._0_4_);
        goto LAB_001d0cf7;
      }
      if ((int)local_16c < 0) {
LAB_001d1af0:
        *local_e0 = 0.0;
        local_140 = (DataKey)((ulong)local_140 & 0xffffffff00000000);
        return (SPxId)local_140;
      }
      iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
      lVar16 = *(long *)(CONCAT44(extraout_var_19,iVar6) + 0x480);
      uVar18 = (ulong)local_16c;
      dVar25 = SVectorBase<double>::operator*
                         ((SVectorBase<double> *)
                          ((long)*(int *)(*(long *)(lVar16 + 0x28) + 4 + uVar18 * 8) * 0x28 +
                          *(long *)(lVar16 + 0x20)),pVVar13);
      plVar3 = local_120;
      *(double *)(*local_120 + uVar18 * 8) = dVar25;
      iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
      bVar5 = SPxSolverBase<double>::isBasic
                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_20,iVar6),
                         (SPxId *)&local_140);
      if (bVar5) {
        SSVectorBase<double>::setValue(local_d8,local_16c,0.0);
        goto LAB_001d0cf7;
      }
      dVar25 = *(double *)(*(long *)(lVar17 + 0x40) + uVar18 * 8);
      dVar27 = *(double *)(*plVar3 + uVar18 * 8);
      if (dVar25 <= 0.0) {
        dVar27 = *(double *)(*local_100 + uVar18 * 8) - dVar27;
        if ((-dVar25 < (double)local_a8._0_8_) &&
           (-dVar27 < (this->super_SPxRatioTester<double>).delta)) {
          iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          SPxSolverBase<double>::shiftLPbound
                    ((SPxSolverBase<double> *)CONCAT44(extraout_var_22,iVar6),local_16c,
                     *(double *)(*plVar3 + uVar18 * 8));
          goto LAB_001d13ba;
        }
      }
      else {
        dVar27 = *(double *)(*local_f8 + uVar18 * 8) - dVar27;
        if ((dVar25 < (double)local_a8._0_8_) &&
           (dVar27 < (this->super_SPxRatioTester<double>).delta)) {
          iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          SPxSolverBase<double>::shiftUPbound
                    ((SPxSolverBase<double> *)CONCAT44(extraout_var_21,iVar6),local_16c,
                     *(double *)(*plVar3 + uVar18 * 8));
LAB_001d13ba:
          uVar19 = local_a8._12_4_;
          local_a8._8_4_ = local_a8._8_4_;
          local_a8._0_8_ = local_a8._0_8_ * 0.5;
          local_a8._12_4_ = uVar19;
          goto LAB_001d0cf7;
        }
      }
      local_158._0_8_ = dVar27 / dVar25;
      local_158._8_8_ = 0;
      if (max < (double)local_158._0_8_) goto LAB_001d0cf7;
      goto LAB_001d1ac8;
    }
    iVar6 = *(int *)(*(long *)(local_e8 + 0x30) + (ulong)uVar15 * 4);
    lVar16 = (long)iVar6;
    dVar25 = *(double *)(*(long *)(local_e8 + 0x40) + lVar16 * 8);
    uVar28 = 0;
    if (dVar25 <= local_78) {
      if (local_98 <= dVar25) {
        SSVectorBase<double>::clearNum(local_d0,uVar12 - 1);
      }
      else {
        dVar27 = *(double *)(*local_c8 + lVar16 * 8) -
                 (local_f0->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16];
        if (dVar27 <= (double)local_138._0_8_) {
          dVar27 = dVar27 / dVar25;
          if (dVar27 <= max) {
            dVar25 = -dVar25;
            uVar28 = 0x8000000000000000;
            goto LAB_001d1180;
          }
        }
        else {
          iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          SPxSolverBase<double>::shiftLCbound
                    ((SPxSolverBase<double> *)CONCAT44(extraout_var_15,iVar7),iVar6,
                     (pVVar13->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16] + (double)local_138._0_8_);
        }
      }
    }
    else {
      dVar27 = *(double *)(*local_c0 + lVar16 * 8) -
               (local_f0->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16];
      if (dVar27 < local_58) {
        iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        SPxSolverBase<double>::shiftUCbound
                  ((SPxSolverBase<double> *)CONCAT44(extraout_var_14,iVar7),iVar6,
                   (pVVar13->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16] - (double)local_138._0_8_);
      }
      else {
        dVar27 = dVar27 / dVar25;
        if (dVar27 <= max) {
LAB_001d1180:
          if (local_118 <= dVar25) goto LAB_001d118f;
        }
      }
    }
    uVar12 = uVar12 - 1;
  } while( true );
LAB_001d1723:
  local_158._4_4_ = uVar20;
  local_158._0_4_ = uVar19;
  local_158._8_4_ = uVar23;
  local_158._12_4_ = uVar24;
  uVar12 = uVar15;
  do {
    pVVar13 = local_f0;
    uVar15 = uVar15 - 1;
    if ((int)uVar12 < 1) {
      iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
      dVar25 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_30,iVar6) + 0x368))
                                 ((long *)CONCAT44(extraout_var_30,iVar6));
      pVVar13 = local_f0;
      iVar6 = local_98._0_4_;
      lVar17 = lVar16;
      if ((local_60 != dVar25) || (NAN(local_60) || NAN(dVar25))) goto LAB_001d140d;
      if (-1 < local_98._0_4_) {
        iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        bVar5 = SPxSolverBase<double>::isBasic
                          ((SPxSolverBase<double> *)CONCAT44(extraout_var_31,iVar7),
                           (SPxId *)&local_140);
        if (!bVar5) goto LAB_001d1ac8;
        SSVectorBase<double>::clearNum(local_d0,iVar6);
        goto LAB_001d140d;
      }
      if ((int)local_16c < 0) goto LAB_001d1af0;
      iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
      lVar14 = *(long *)(CONCAT44(extraout_var_32,iVar6) + 0x480);
      uVar18 = (ulong)local_16c;
      dVar25 = SVectorBase<double>::operator*
                         ((SVectorBase<double> *)
                          ((long)*(int *)(*(long *)(lVar14 + 0x28) + 4 + uVar18 * 8) * 0x28 +
                          *(long *)(lVar14 + 0x20)),pVVar13);
      plVar3 = local_120;
      *(double *)(*local_120 + uVar18 * 8) = dVar25;
      iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
      bVar5 = SPxSolverBase<double>::isBasic
                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_33,iVar6),
                         (SPxId *)&local_140);
      if (bVar5) {
        SSVectorBase<double>::setValue(local_d8,local_16c,0.0);
        goto LAB_001d140d;
      }
      dVar25 = *(double *)(*(long *)(lVar16 + 0x40) + uVar18 * 8);
      dVar27 = *(double *)(*plVar3 + uVar18 * 8);
      if (dVar25 <= 0.0) {
        dVar27 = *(double *)(*local_f8 + uVar18 * 8) - dVar27;
        if ((-dVar25 < (double)local_a8._0_8_) &&
           (dVar27 < (this->super_SPxRatioTester<double>).delta)) {
          iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          SPxSolverBase<double>::shiftUPbound
                    ((SPxSolverBase<double> *)CONCAT44(extraout_var_35,iVar6),local_16c,
                     *(double *)(*plVar3 + uVar18 * 8));
          goto LAB_001d1a8b;
        }
      }
      else {
        dVar27 = *(double *)(*local_100 + uVar18 * 8) - dVar27;
        if ((dVar25 < (double)local_a8._0_8_) &&
           (-dVar27 < (this->super_SPxRatioTester<double>).delta)) {
          iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          SPxSolverBase<double>::shiftLPbound
                    ((SPxSolverBase<double> *)CONCAT44(extraout_var_34,iVar6),local_16c,
                     *(double *)(*plVar3 + uVar18 * 8));
LAB_001d1a8b:
          uVar19 = local_a8._12_4_;
          local_a8._8_4_ = local_a8._8_4_;
          local_a8._0_8_ = local_a8._0_8_ * 0.5;
          local_a8._12_4_ = uVar19;
          goto LAB_001d140d;
        }
      }
      local_158._0_8_ = dVar27 / dVar25;
      local_158._8_8_ = 0;
      if (max <= (double)local_158._0_8_) goto LAB_001d1ac8;
      goto LAB_001d140d;
    }
    iVar6 = *(int *)(*(long *)(local_e8 + 0x30) + (ulong)uVar15 * 4);
    lVar17 = (long)iVar6;
    dVar25 = *(double *)(*(long *)(local_e8 + 0x40) + lVar17 * 8);
    uVar28 = 0;
    if (dVar25 <= local_78) {
      if (local_58 <= dVar25) {
        SSVectorBase<double>::clearNum(local_d0,uVar12 - 1);
      }
      else {
        dVar27 = *(double *)(*local_c0 + lVar17 * 8) -
                 (local_f0->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar17];
        if (local_118 <= dVar27) {
          dVar27 = dVar27 / dVar25;
          if (max <= dVar27) {
            uVar28 = 0x8000000000000000;
            dVar25 = -dVar25;
            goto joined_r0x001d1860;
          }
          goto LAB_001d183e;
        }
        iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        SPxSolverBase<double>::shiftUCbound
                  ((SPxSolverBase<double> *)CONCAT44(extraout_var_28,iVar7),iVar6,
                   (pVVar13->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17]);
      }
LAB_001d1838:
      uVar21 = local_138._0_4_;
      uVar22 = local_138._4_4_;
    }
    else {
      dVar27 = *(double *)(*local_c8 + lVar17 * 8) -
               (local_f0->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar17];
      if ((double)CONCAT44(uVar22,uVar21) <= dVar27 && dVar27 != (double)CONCAT44(uVar22,uVar21)) {
        iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        SPxSolverBase<double>::shiftLCbound
                  ((SPxSolverBase<double> *)CONCAT44(extraout_var_27,iVar7),iVar6,
                   (pVVar13->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17]);
        goto LAB_001d1838;
      }
      dVar27 = dVar27 / dVar25;
      if (max <= dVar27) {
joined_r0x001d1860:
        if (local_168 < dVar25) break;
      }
    }
LAB_001d183e:
    uVar12 = uVar12 - 1;
  } while( true );
  local_158._8_8_ = uVar28;
  local_158._0_8_ = dVar25;
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  local_140 = (DataKey)SPxSolverBase<double>::coId
                                 ((SPxSolverBase<double> *)CONCAT44(extraout_var_29,iVar7),iVar6);
  local_98 = (double)CONCAT44(local_98._4_4_,uVar12 - 1);
  uVar19 = SUB84(dVar27,0);
  uVar20 = (undefined4)((ulong)dVar27 >> 0x20);
  uVar23 = 0;
  uVar24 = 0;
  local_168 = (double)local_158._0_8_;
  uVar21 = local_138._0_4_;
  uVar22 = local_138._4_4_;
  goto LAB_001d1723;
LAB_001d118f:
  local_158._8_8_ = uVar28;
  local_158._0_8_ = dVar25;
  local_118 = dVar27;
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  local_140 = (DataKey)SPxSolverBase<double>::coId
                                 ((SPxSolverBase<double> *)CONCAT44(extraout_var_16,iVar7),iVar6);
  uVar19 = SUB84(local_118,0);
  uVar20 = (undefined4)((ulong)local_118 >> 0x20);
  uVar21 = 0;
  uVar22 = 0;
  local_118 = (double)local_158._0_8_;
  local_168._0_4_ = uVar12 - 1;
  goto LAB_001d103d;
LAB_001d0f4a:
  dVar26 = dVar26 / dVar25;
  lVar17 = lVar16;
  if (dVar26 <= max) {
LAB_001d0fa2:
    lVar17 = lVar16;
    if (local_118 <= dVar25) {
      local_118 = dVar25;
      uStack_110 = uVar28;
      local_158._0_8_ = dVar26;
      iVar6 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
      local_140 = (DataKey)SPxSolverBase<double>::id
                                     ((SPxSolverBase<double> *)CONCAT44(extraout_var_13,iVar6),uVar1
                                     );
      local_158._8_8_ = 0;
      uVar19 = local_88._0_4_;
      uVar20 = local_88._4_4_;
      uVar21 = local_88._8_4_;
      uVar22 = local_88._12_4_;
      uVar12 = uVar15;
      local_16c = uVar1;
    }
  }
  goto LAB_001d0e53;
}

Assistant:

SPxId SPxHarrisRT<R>::selectEnter(R& val, int, bool)
{
   int i, j;
   SPxId enterId;
   R stab, x, y;
   R max = 0.0;
   R sel = 0.0;
   R lastshift;
   R cuseeps;
   R ruseeps;
   R cmaxabs = 1;
   R rmaxabs = 1;
   int pnr, cnr;

   R minStability = this->tolerances()->scaleAccordingToEpsilon(1e-4);
   R epsilon      = this->solver()->epsilon();
   R degeneps     = degenerateEps();

   VectorBase<R>& pvec = this->solver()->pVec();
   SSVectorBase<R>& pupd = this->solver()->pVec().delta();

   VectorBase<R>& cvec = this->solver()->coPvec();
   SSVectorBase<R>& cupd = this->solver()->coPvec().delta();

   const VectorBase<R>& upb = this->solver()->upBound();
   const VectorBase<R>& lpb = this->solver()->lpBound();
   const VectorBase<R>& ucb = this->solver()->ucBound();
   const VectorBase<R>& lcb = this->solver()->lcBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   if(val > epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);

         // phase 1:
         maxDelta(
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         maxDelta(
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(-infinity);
         ruseeps = rmaxabs * 0.001 * epsilon;

         if(ruseeps < epsilon)
            ruseeps = epsilon;

         cuseeps = cmaxabs * 0.001 * epsilon;

         if(cuseeps < epsilon)
            cuseeps = epsilon;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI01 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI02 removing value {}\n", cupd[i]);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(x < minStability && sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(-x < minStability && -sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel > max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }
   else if(val < -epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);


         // phase 1:
         minDelta
         (
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         minDelta
         (
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(infinity);
         ruseeps = rmaxabs * epsilon * 0.001;
         cuseeps = cmaxabs * epsilon * 0.001;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI03 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI04 removing value {}\n", x);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(x < minStability && -sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(-x < minStability && sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel < max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }

   assert(max * val >= 0);
   assert(enterId.type() != SPxId::INVALID);

   val = sel;

   return enterId;
}